

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

int __thiscall xercesc_4_0::TraverseSchema::init(TraverseSchema *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  DatatypeValidatorFactory *pDVar4;
  XMLStringPool *pXVar5;
  ValueVectorOf<unsigned_int> *pVVar6;
  undefined4 extraout_var;
  ValueVectorOf<xercesc_4_0::DOMNode_*> *this_00;
  RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *this_01;
  RefHashTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::PtrHasher> *this_02;
  XSDLocator *this_03;
  ValueVectorOf<const_xercesc_4_0::DOMElement_*> *this_04;
  uint local_20;
  uint i;
  TraverseSchema *this_local;
  
  XSDErrorReporter::setErrorReporter(&this->fXSDErrorReporter,this->fErrorReporter);
  bVar1 = XMLScanner::getExitOnFirstFatal(this->fScanner);
  XSDErrorReporter::setExitOnFirstFatal(&this->fXSDErrorReporter,bVar1);
  bVar1 = XMLScanner::getValidationSchemaFullChecking(this->fScanner);
  this->fFullConstraintChecking = bVar1;
  pDVar4 = SchemaGrammar::getDatatypeRegistry(this->fSchemaGrammar);
  this->fDatatypeRegistry = pDVar4;
  pXVar5 = GrammarResolver::getStringPool(this->fGrammarResolver);
  this->fStringPool = pXVar5;
  uVar2 = XMLScanner::getEmptyNamespaceId(this->fScanner);
  this->fEmptyNamespaceURI = uVar2;
  pVVar6 = (ValueVectorOf<unsigned_int> *)XMemory::operator_new(0x28,this->fMemoryManager);
  ValueVectorOf<unsigned_int>::ValueVectorOf(pVVar6,8,this->fMemoryManager,false);
  this->fCurrentTypeNameStack = pVVar6;
  pVVar6 = (ValueVectorOf<unsigned_int> *)XMemory::operator_new(0x28,this->fMemoryManager);
  ValueVectorOf<unsigned_int>::ValueVectorOf(pVVar6,8,this->fMemoryManager,false);
  this->fCurrentGroupStack = pVVar6;
  iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])();
  this->fGlobalDeclarations = (ValueVectorOf<unsigned_int> **)CONCAT44(extraout_var,iVar3);
  memset(this->fGlobalDeclarations,0,0x30);
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    pVVar6 = (ValueVectorOf<unsigned_int> *)XMemory::operator_new(0x28,this->fMemoryManager);
    ValueVectorOf<unsigned_int>::ValueVectorOf(pVVar6,8,this->fMemoryManager,false);
    this->fGlobalDeclarations[local_20] = pVVar6;
  }
  this_00 = (ValueVectorOf<xercesc_4_0::DOMNode_*> *)
            XMemory::operator_new(0x28,this->fMemoryManager);
  ValueVectorOf<xercesc_4_0::DOMNode_*>::ValueVectorOf(this_00,4,this->fMemoryManager,false);
  this->fNonXSAttList = this_00;
  this_01 = (RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *)
            XMemory::operator_new(0x30,this->fMemoryManager);
  RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::RefHash2KeysTableOf
            (this_01,0xd,false,this->fMemoryManager);
  this->fNotationRegistry = this_01;
  this_02 = (RefHashTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::PtrHasher> *)
            XMemory::operator_new(0x38,this->fMemoryManager);
  RefHashTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::PtrHasher>::RefHashTableOf
            (this_02,0x1d,false,this->fMemoryManager);
  this->fPreprocessedNodes = this_02;
  this_03 = (XSDLocator *)XMemory::operator_new(0x28,this->fMemoryManager);
  XSDLocator::XSDLocator(this_03);
  this->fLocator = this_03;
  this_04 = (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)
            XMemory::operator_new(0x28,this->fMemoryManager);
  ValueVectorOf<const_xercesc_4_0::DOMElement_*>::ValueVectorOf
            (this_04,0x10,this->fMemoryManager,false);
  this->fDeclStack = this_04;
  return (int)this;
}

Assistant:

void TraverseSchema::init() {

    fXSDErrorReporter.setErrorReporter(fErrorReporter);
    fXSDErrorReporter.setExitOnFirstFatal(fScanner->getExitOnFirstFatal());

    fFullConstraintChecking = fScanner->getValidationSchemaFullChecking();

    fDatatypeRegistry = fSchemaGrammar->getDatatypeRegistry();
    fStringPool = fGrammarResolver->getStringPool();
    fEmptyNamespaceURI = fScanner->getEmptyNamespaceId();
    fCurrentTypeNameStack = new (fMemoryManager) ValueVectorOf<unsigned int>(8, fMemoryManager);
    fCurrentGroupStack = new (fMemoryManager) ValueVectorOf<unsigned int>(8, fMemoryManager);

    fGlobalDeclarations = (ValueVectorOf<unsigned int>**) fMemoryManager->allocate
    (
        ENUM_ELT_SIZE * sizeof(ValueVectorOf<unsigned int>*)
    );//new ValueVectorOf<unsigned int>*[ENUM_ELT_SIZE];
    memset(fGlobalDeclarations, 0, ENUM_ELT_SIZE * sizeof(ValueVectorOf<unsigned int>*));
    for(unsigned int i=0; i < ENUM_ELT_SIZE; i++)
        fGlobalDeclarations[i] = new (fMemoryManager) ValueVectorOf<unsigned int>(8, fMemoryManager);

    fNonXSAttList = new (fMemoryManager) ValueVectorOf<DOMNode*>(4, fMemoryManager);
    fNotationRegistry = new (fMemoryManager) RefHash2KeysTableOf<XMLCh>(13, (bool) false, fMemoryManager);
    fPreprocessedNodes = new (fMemoryManager) RefHashTableOf<SchemaInfo, PtrHasher>
    (
        29
        , false
        , fMemoryManager
    );
    fLocator = new (fMemoryManager) XSDLocator();
    fDeclStack = new (fMemoryManager) ValueVectorOf<const DOMElement*>(16, fMemoryManager);
}